

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

DWORD __thiscall TSparseArray::GetItem1(TSparseArray *this,DWORD index)

{
  DWORD DVar1;
  uint *puVar2;
  _BASEVALS *p_Var3;
  uint uVar4;
  uint local_34;
  int local_30;
  DWORD bitGroup;
  DWORD itemIndex;
  DWORD dwordIndex;
  DWORD groupIndex;
  DWORD distFromBase;
  SETBITS setBits;
  DWORD index_local;
  TSparseArray *this_local;
  
  if ((index & 0x1ff) == 0) {
    puVar2 = TGenericArray<unsigned_int>::operator[](&this->IndexToItem1,(ulong)(index >> 9));
    this_local._4_4_ = *puVar2;
  }
  else {
    DVar1 = FindGroup_Items1(this,index);
    p_Var3 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)DVar1);
    dwordIndex = index - p_Var3->BaseValue200;
    bitGroup = DVar1 * 0x10;
    p_Var3 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)DVar1);
    if (dwordIndex < ((uint)(*(ulong *)&p_Var3->field_0x4 >> 0x17) & 0x1ff)) {
      p_Var3 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)DVar1);
      if (dwordIndex < ((uint)(*(ulong *)&p_Var3->field_0x4 >> 7) & 0xff)) {
        p_Var3 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)DVar1);
        if (((uint)*(undefined8 *)&p_Var3->field_0x4 & 0x7f) <= dwordIndex) {
          p_Var3 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)DVar1);
          dwordIndex = dwordIndex - ((uint)*(undefined8 *)&p_Var3->field_0x4 & 0x7f);
          bitGroup = bitGroup + 2;
        }
      }
      else {
        p_Var3 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)DVar1);
        if (dwordIndex < ((uint)(*(ulong *)&p_Var3->field_0x4 >> 0xf) & 0xff)) {
          p_Var3 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)DVar1);
          uVar4 = (uint)(*(ulong *)&p_Var3->field_0x4 >> 7);
          bitGroup = bitGroup + 4;
        }
        else {
          p_Var3 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)DVar1);
          uVar4 = (uint)(*(ulong *)&p_Var3->field_0x4 >> 0xf);
          bitGroup = bitGroup + 6;
        }
        dwordIndex = dwordIndex - (uVar4 & 0xff);
      }
    }
    else {
      p_Var3 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)DVar1);
      if (dwordIndex < ((uint)((ulong)*(undefined8 *)&p_Var3->field_0x4 >> 0x29) & 0x1ff)) {
        p_Var3 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)DVar1);
        if (dwordIndex < ((uint)((ulong)*(undefined8 *)&p_Var3->field_0x4 >> 0x20) & 0x1ff)) {
          p_Var3 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)DVar1);
          uVar4 = (uint)(*(ulong *)&p_Var3->field_0x4 >> 0x17);
          bitGroup = bitGroup + 8;
        }
        else {
          p_Var3 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)DVar1);
          uVar4 = (uint)((ulong)*(undefined8 *)&p_Var3->field_0x4 >> 0x20);
          bitGroup = bitGroup + 10;
        }
      }
      else {
        p_Var3 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)DVar1);
        if (dwordIndex < ((uint)((ulong)*(undefined8 *)&p_Var3->field_0x4 >> 0x32) & 0x1ff)) {
          p_Var3 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)DVar1);
          uVar4 = (uint)((ulong)*(undefined8 *)&p_Var3->field_0x4 >> 0x29);
          bitGroup = bitGroup + 0xc;
        }
        else {
          p_Var3 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)DVar1);
          uVar4 = (uint)((ulong)*(undefined8 *)&p_Var3->field_0x4 >> 0x32);
          bitGroup = bitGroup + 0xe;
        }
      }
      dwordIndex = dwordIndex - (uVar4 & 0x1ff);
    }
    puVar2 = TGenericArray<unsigned_int>::operator[](&this->ItemBits,(ulong)bitGroup);
    local_34 = *puVar2;
    groupIndex = (DWORD)GetNumberOfSetBits(local_34);
    if (groupIndex >> 0x18 <= dwordIndex) {
      bitGroup = bitGroup + 1;
      puVar2 = TGenericArray<unsigned_int>::operator[](&this->ItemBits,(ulong)bitGroup);
      local_34 = *puVar2;
      dwordIndex = dwordIndex - (groupIndex >> 0x18);
      groupIndex = (DWORD)GetNumberOfSetBits(local_34);
    }
    local_30 = bitGroup * 0x20;
    if (dwordIndex < (groupIndex >> 8 & 0xff)) {
      if ((groupIndex & 0xff) <= dwordIndex) {
        local_30 = local_30 + 8;
        local_34 = local_34 >> 8;
        dwordIndex = dwordIndex - (groupIndex & 0xff);
      }
    }
    else {
      if (dwordIndex < (groupIndex >> 0x10 & 0xff)) {
        local_34 = local_34 >> 0x10;
        local_30 = local_30 + 0x10;
        uVar4 = groupIndex >> 8;
      }
      else {
        local_34 = local_34 >> 0x18;
        local_30 = local_30 + 0x18;
        uVar4 = groupIndex >> 0x10;
      }
      dwordIndex = dwordIndex - (uVar4 & 0xff);
    }
    if (0x7ff < (local_34 & 0xff) + dwordIndex * 0x100) {
      __assert_fail("(bitGroup + distFromBase) < sizeof(table_1BA1818)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_MNDX.cpp"
                    ,0x498,"DWORD TSparseArray::GetItem1(DWORD)");
    }
    this_local._4_4_ = (uint)table_1BA1818[(local_34 & 0xff) + dwordIndex * 0x100] + local_30;
  }
  return this_local._4_4_;
}

Assistant:

DWORD GetItem1(DWORD index)
    {
        SETBITS setBits;
        DWORD distFromBase;
        DWORD groupIndex;
        DWORD dwordIndex;
        DWORD itemIndex;
        DWORD bitGroup;

        // If the index is at begin of the group, we just return the start value
        if ((index & 0x1FF) == 0)
            return IndexToItem1[INDEX_TO_GROUP(index)];

        // Find the group where the index belongs to
        groupIndex = FindGroup_Items1(index);

        // Calculate the base200 dword index (HOTS: 1959FD4)
        distFromBase = index - BaseVals[groupIndex].BaseValue200;
        dwordIndex = groupIndex << 0x04;

        // Calculate the dword index including the sub-checkpoint
        if (distFromBase < BaseVals[groupIndex].AddValue100)
        {
            // HOTS: 1959FF1
            if (distFromBase < BaseVals[groupIndex].AddValue80)
            {
                // HOTS: 0195A000
                if (distFromBase >= BaseVals[groupIndex].AddValue40)
                {
                    // HOTS: 195A007
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValue40;
                    dwordIndex += 2;
                }
            }
            else
            {
                // HOTS: 195A00E
                if (distFromBase < BaseVals[groupIndex].AddValueC0)
                {
                    // HOTS: 195A01A
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValue80;
                    dwordIndex += 4;
                }
                else
                {
                    // HOTS: 195A01F
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValueC0;
                    dwordIndex += 6;
                }
            }
        }
        else
        {
            // HOTS: 195A026
            if (distFromBase < BaseVals[groupIndex].AddValue180)
            {
                // HOTS: 195A037
                if (distFromBase < BaseVals[groupIndex].AddValue140)
                {
                    // HOTS: 195A041
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValue100;
                    dwordIndex += 8;
                }
                else
                {
                    // HOTS: 195A048
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValue140;
                    dwordIndex += 10;
                }
            }
            else
            {
                // HOTS: 195A04D
                if (distFromBase < BaseVals[groupIndex].AddValue1C0)
                {
                    // HOTS: 195A05A
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValue180;
                    dwordIndex += 12;
                }
                else
                {
                    // HOTS: 195A061
                    distFromBase = distFromBase - BaseVals[groupIndex].AddValue1C0;
                    dwordIndex += 14;
                }
            }
        }

        // HOTS: 195A066
        bitGroup = ItemBits[dwordIndex];
        setBits = GetNumberOfSetBits(bitGroup);

        // Get total number of set bits in the bit group
        if (distFromBase >= setBits.u.Lower32)
        {
            // HOTS: 195A0B2
            bitGroup = ItemBits[++dwordIndex];
            distFromBase = distFromBase - setBits.u.Lower32;
            setBits = GetNumberOfSetBits(bitGroup);
        }

        // Calculate the item index
        itemIndex = (dwordIndex << 0x05);

        // Get the number of set bits in the lower word (HOTS: 195A0F6)
        if (distFromBase < setBits.u.Lower16)
        {
            // HOTS: 195A111
            if (distFromBase >= setBits.u.Lower08)
            {
                // HOTS: 195A111
                itemIndex = itemIndex + 0x08;
                bitGroup = bitGroup >> 0x08;
                distFromBase = distFromBase - setBits.u.Lower08;
            }
        }
        else
        {
            // HOTS: 195A119
            if (distFromBase < setBits.u.Lower24)
            {
                // HOTS: 195A125
                bitGroup = bitGroup >> 0x10;
                itemIndex = itemIndex + 0x10;
                distFromBase = distFromBase - setBits.u.Lower16;
            }
            else
            {
                // HOTS: 195A12F
                bitGroup = bitGroup >> 0x18;
                itemIndex = itemIndex + 0x18;
                distFromBase = distFromBase - setBits.u.Lower24;
            }
        }

        bitGroup = bitGroup & 0xFF;
        distFromBase = distFromBase << 0x08;

        // BUGBUG: Potential buffer overflow
        // Happens in Heroes of the Storm when index == 0x5B
        assert((bitGroup + distFromBase) < sizeof(table_1BA1818));
        return table_1BA1818[bitGroup + distFromBase] + itemIndex;
    }